

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_append_internal<duckdb::Value>(duckdb_appender appender,Value *value)

{
  pointer this;
  ErrorData error;
  Value local_e0 [3];
  
  if (appender != (duckdb_appender)0x0) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                      appender);
    duckdb::Value::Value(local_e0,value);
    duckdb::BaseAppender::Append<duckdb::Value>(&this->super_BaseAppender,local_e0);
    duckdb::Value::~Value(local_e0);
  }
  return (uint)(appender == (duckdb_appender)0x0);
}

Assistant:

duckdb_state duckdb_append_internal(duckdb_appender appender, T value) {
	if (!appender) {
		return DuckDBError;
	}
	auto *appender_instance = reinterpret_cast<AppenderWrapper *>(appender);
	try {
		appender_instance->appender->Append<T>(value);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		appender_instance->error = error.RawMessage();
		return DuckDBError;
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}